

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O3

void jpeg_fdct_16x16(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  JSAMPROW pJVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  DCTELEM workspace [64];
  int *local_1a8;
  int local_138 [8];
  int aiStack_118 [8];
  int aiStack_f8 [8];
  int aiStack_d8 [8];
  int aiStack_b8 [8];
  int aiStack_98 [8];
  int aiStack_78 [8];
  int aiStack_58 [10];
  
  uVar11 = (ulong)start_col;
  lVar19 = 0;
  local_1a8 = data;
  do {
    pJVar10 = sample_data[lVar19];
    uVar27 = (ulong)((uint)pJVar10[uVar11] + (uint)pJVar10[uVar11 + 0xf]);
    uVar31 = (ulong)((uint)pJVar10[uVar11 + 1] + (uint)pJVar10[uVar11 + 0xe]);
    uVar26 = (ulong)((uint)pJVar10[uVar11 + 6] + (uint)pJVar10[uVar11 + 9]);
    uVar12 = (ulong)((uint)pJVar10[uVar11 + 7] + (uint)pJVar10[uVar11 + 8]);
    lVar17 = uVar12 + uVar27;
    lVar28 = uVar27 - uVar12;
    lVar18 = uVar26 + uVar31;
    lVar32 = uVar31 - uVar26;
    uVar26 = (ulong)((uint)pJVar10[uVar11 + 2] + (uint)pJVar10[uVar11 + 0xd]);
    uVar12 = (ulong)((uint)pJVar10[uVar11 + 5] + (uint)pJVar10[uVar11 + 10]);
    lVar20 = uVar12 + uVar26;
    lVar33 = uVar26 - uVar12;
    uVar12 = (ulong)((uint)pJVar10[uVar11 + 3] + (uint)pJVar10[uVar11 + 0xc]);
    uVar26 = (ulong)((uint)pJVar10[uVar11 + 4] + (uint)pJVar10[uVar11 + 0xb]);
    lVar22 = uVar26 + uVar12;
    lVar21 = uVar12 - uVar26;
    lVar29 = (ulong)pJVar10[uVar11] - (ulong)pJVar10[uVar11 + 0xf];
    lVar15 = (ulong)pJVar10[uVar11 + 1] - (ulong)pJVar10[uVar11 + 0xe];
    lVar24 = (ulong)pJVar10[uVar11 + 2] - (ulong)pJVar10[uVar11 + 0xd];
    lVar16 = (ulong)pJVar10[uVar11 + 3] - (ulong)pJVar10[uVar11 + 0xc];
    lVar13 = (ulong)pJVar10[uVar11 + 4] - (ulong)pJVar10[uVar11 + 0xb];
    lVar30 = (ulong)pJVar10[uVar11 + 5] - (ulong)pJVar10[uVar11 + 10];
    lVar23 = (ulong)pJVar10[uVar11 + 6] - (ulong)pJVar10[uVar11 + 9];
    lVar25 = (ulong)pJVar10[uVar11 + 7] - (ulong)pJVar10[uVar11 + 8];
    *local_1a8 = ((int)lVar17 + (int)lVar18 + (int)lVar20 + (int)lVar22) * 4 + -0x2000;
    local_1a8[4] = (int)((lVar18 - lVar20) * 0x1151 + (lVar17 - lVar22) * 0x29cf + 0x400U >> 0xb);
    lVar17 = (lVar28 - lVar33) * 0x2c63 + (lVar21 - lVar32) * 0x8d4;
    local_1a8[2] = (int)((ulong)(lVar33 * 0x4587 + lVar17 + 0x400 + lVar32 * 0x2e75) >> 0xb);
    local_1a8[6] = (int)((ulong)(lVar21 * 0x7ffffffde07 + lVar17 + 0x400 + lVar28 * 0x7fffffff93e)
                        >> 0xb);
    lVar20 = (lVar23 - lVar25) * 0xd23 + (lVar29 + lVar15) * 0x2b4e;
    lVar18 = (lVar25 + lVar30) * 0x1555 + (lVar24 + lVar29) * 0x27e9;
    lVar22 = (lVar13 - lVar25) * 0x1cb6 + (lVar16 + lVar29) * 0x22fc;
    lVar28 = (lVar23 - lVar30) * 0x2d09 + (lVar24 + lVar15) * 0x470;
    lVar17 = (lVar13 + lVar23) * -0x27e9 + (lVar16 + lVar15) * -0x1555;
    lVar21 = (lVar30 - lVar13) * 0xd23 + (lVar16 + lVar24) * -0x2b4e;
    local_1a8[1] = (int)(lVar25 * 0x18f3 + lVar29 * 0x7ffffffb6d6 + lVar18 + lVar20 + lVar22 +
                         0x400U >> 0xb);
    local_1a8[3] = (int)(lVar20 + lVar28 + lVar23 * 0x7ffffffcac1 + lVar15 * 0x24d + lVar17 + 0x400U
                        >> 0xb);
    local_1a8[5] = (int)((ulong)(lVar30 * 0x2747 + lVar28 + lVar24 * -0x2406 + lVar21 + 0x400 +
                                lVar18) >> 0xb);
    local_1a8[7] = (int)((ulong)(lVar13 * 0x4560 + lVar17 + lVar16 * 0x2218 + lVar21 + 0x400 +
                                lVar22) >> 0xb);
    piVar14 = local_138;
    if ((int)lVar19 != 7) {
      if ((int)lVar19 == 0xf) {
        lVar19 = 0;
        do {
          iVar1 = aiStack_58[lVar19];
          iVar2 = data[lVar19];
          lVar28 = (long)(iVar1 + iVar2);
          iVar3 = aiStack_78[lVar19];
          lVar23 = (long)(iVar3 + data[lVar19 + 8]);
          iVar4 = aiStack_98[lVar19];
          iVar5 = local_138[lVar19];
          iVar6 = aiStack_118[lVar19];
          lVar20 = (long)(iVar6 + data[lVar19 + 0x30]);
          lVar18 = (long)(data[lVar19 + 0x38] + iVar5);
          lVar17 = lVar18 + lVar28;
          lVar28 = lVar28 - lVar18;
          lVar18 = lVar20 + lVar23;
          lVar23 = lVar23 - lVar20;
          lVar32 = (long)(iVar4 + data[lVar19 + 0x10]);
          iVar7 = aiStack_f8[lVar19];
          lVar22 = (long)(iVar7 + data[lVar19 + 0x28]);
          lVar20 = lVar22 + lVar32;
          lVar32 = lVar32 - lVar22;
          iVar8 = aiStack_b8[lVar19];
          lVar25 = (long)(iVar8 + data[lVar19 + 0x18]);
          iVar9 = aiStack_d8[lVar19];
          lVar15 = (long)(iVar9 + data[lVar19 + 0x20]);
          lVar22 = lVar15 + lVar25;
          lVar25 = lVar25 - lVar15;
          data[lVar19] = (DCTELEM)(lVar22 + lVar20 + lVar18 + lVar17 + 8U >> 4);
          lVar15 = (long)(iVar2 - iVar1);
          lVar13 = (long)(data[lVar19 + 8] - iVar3);
          lVar30 = (long)(data[lVar19 + 0x10] - iVar4);
          lVar16 = (long)(data[lVar19 + 0x18] - iVar8);
          lVar21 = (long)(data[lVar19 + 0x20] - iVar9);
          lVar24 = (long)(data[lVar19 + 0x28] - iVar7);
          lVar33 = (long)(data[lVar19 + 0x30] - iVar6);
          lVar29 = (long)(data[lVar19 + 0x38] - iVar5);
          data[lVar19 + 0x20] =
               (DCTELEM)((lVar18 - lVar20) * 0x1151 + (lVar17 - lVar22) * 0x29cf + 0x10000U >> 0x11)
          ;
          lVar17 = (lVar28 - lVar32) * 0x2c63 + (lVar25 - lVar23) * 0x8d4;
          data[lVar19 + 0x10] =
               (DCTELEM)((ulong)(lVar32 * 0x4587 + lVar17 + 0x10000 + lVar23 * 0x2e75) >> 0x11);
          data[lVar19 + 0x30] =
               (DCTELEM)((ulong)(lVar25 * 0x1ffffffffde07 + lVar17 + 0x10000 +
                                lVar28 * 0x1fffffffff93e) >> 0x11);
          lVar20 = (lVar33 - lVar29) * 0xd23 + (lVar13 + lVar15) * 0x2b4e;
          lVar17 = (lVar29 + lVar24) * 0x1555 + (lVar30 + lVar15) * 0x27e9;
          lVar25 = (lVar21 - lVar29) * 0x1cb6 + (lVar16 + lVar15) * 0x22fc;
          lVar23 = (lVar33 - lVar24) * 0x2d09 + (lVar30 + lVar13) * 0x470;
          lVar22 = (lVar33 + lVar21) * -0x27e9 + (lVar16 + lVar13) * -0x1555;
          lVar18 = (lVar24 - lVar21) * 0xd23 + (lVar16 + lVar30) * -0x2b4e;
          data[lVar19 + 8] =
               (DCTELEM)(lVar29 * 0x18f3 + lVar15 * 0x1ffffffffb6d6 + lVar17 + lVar20 + lVar25 +
                         0x10000U >> 0x11);
          data[lVar19 + 0x18] =
               (DCTELEM)(lVar20 + lVar23 + lVar33 * 0x1ffffffffcac1 + lVar13 * 0x24d + lVar22 +
                         0x10000U >> 0x11);
          data[lVar19 + 0x28] =
               (DCTELEM)((ulong)(lVar24 * 0x2747 + lVar23 + lVar30 * -0x2406 + lVar18 + 0x10000 +
                                lVar17) >> 0x11);
          data[lVar19 + 0x38] =
               (DCTELEM)((ulong)(lVar21 * 0x4560 + lVar22 + lVar16 * 0x2218 + lVar18 + 0x10000 +
                                lVar25) >> 0x11);
          lVar19 = lVar19 + 1;
        } while ((int)lVar19 != 8);
        return;
      }
      piVar14 = local_1a8 + 8;
    }
    lVar19 = lVar19 + 1;
    local_1a8 = piVar14;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_fdct_16x16 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16, tmp17;
  DCTELEM workspace[DCTSIZE2];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* cK represents sqrt(2) * cos(K*pi/32). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[15]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[14]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[13]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[12]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[11]);
    tmp5 = GETJSAMPLE(elemptr[5]) + GETJSAMPLE(elemptr[10]);
    tmp6 = GETJSAMPLE(elemptr[6]) + GETJSAMPLE(elemptr[9]);
    tmp7 = GETJSAMPLE(elemptr[7]) + GETJSAMPLE(elemptr[8]);

    tmp10 = tmp0 + tmp7;
    tmp14 = tmp0 - tmp7;
    tmp11 = tmp1 + tmp6;
    tmp15 = tmp1 - tmp6;
    tmp12 = tmp2 + tmp5;
    tmp16 = tmp2 - tmp5;
    tmp13 = tmp3 + tmp4;
    tmp17 = tmp3 - tmp4;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[15]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[14]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[13]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[12]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[11]);
    tmp5 = GETJSAMPLE(elemptr[5]) - GETJSAMPLE(elemptr[10]);
    tmp6 = GETJSAMPLE(elemptr[6]) - GETJSAMPLE(elemptr[9]);
    tmp7 = GETJSAMPLE(elemptr[7]) - GETJSAMPLE(elemptr[8]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 + tmp12 + tmp13 - 16 * CENTERJSAMPLE) << PASS1_BITS);
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(1.306562965)) + /* c4[16] = c2[8] */
	      MULTIPLY(tmp11 - tmp12, FIX_0_541196100),   /* c12[16] = c6[8] */
	      CONST_BITS-PASS1_BITS);

    tmp10 = MULTIPLY(tmp17 - tmp15, FIX(0.275899379)) +   /* c14[16] = c7[8] */
	    MULTIPLY(tmp14 - tmp16, FIX(1.387039845));    /* c2[16] = c1[8] */

    dataptr[2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp15, FIX(1.451774982))   /* c6+c14 */
	      + MULTIPLY(tmp16, FIX(2.172734804)),        /* c2+c10 */
	      CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(0.211164243))   /* c2-c6 */
	      - MULTIPLY(tmp17, FIX(1.061594338)),        /* c10+c14 */
	      CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp11 = MULTIPLY(tmp0 + tmp1, FIX(1.353318001)) +         /* c3 */
	    MULTIPLY(tmp6 - tmp7, FIX(0.410524528));          /* c13 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(1.247225013)) +         /* c5 */
	    MULTIPLY(tmp5 + tmp7, FIX(0.666655658));          /* c11 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(1.093201867)) +         /* c7 */
	    MULTIPLY(tmp4 - tmp7, FIX(0.897167586));          /* c9 */
    tmp14 = MULTIPLY(tmp1 + tmp2, FIX(0.138617169)) +         /* c15 */
	    MULTIPLY(tmp6 - tmp5, FIX(1.407403738));          /* c1 */
    tmp15 = MULTIPLY(tmp1 + tmp3, - FIX(0.666655658)) +       /* -c11 */
	    MULTIPLY(tmp4 + tmp6, - FIX(1.247225013));        /* -c5 */
    tmp16 = MULTIPLY(tmp2 + tmp3, - FIX(1.353318001)) +       /* -c3 */
	    MULTIPLY(tmp5 - tmp4, FIX(0.410524528));          /* c13 */
    tmp10 = tmp11 + tmp12 + tmp13 -
	    MULTIPLY(tmp0, FIX(2.286341144)) +                /* c7+c5+c3-c1 */
	    MULTIPLY(tmp7, FIX(0.779653625));                 /* c15+c13-c11+c9 */
    tmp11 += tmp14 + tmp15 + MULTIPLY(tmp1, FIX(0.071888074)) /* c9-c3-c15+c11 */
	     - MULTIPLY(tmp6, FIX(1.663905119));              /* c7+c13+c1-c5 */
    tmp12 += tmp14 + tmp16 - MULTIPLY(tmp2, FIX(1.125726048)) /* c7+c5+c15-c3 */
	     + MULTIPLY(tmp5, FIX(1.227391138));              /* c9-c11+c1-c13 */
    tmp13 += tmp15 + tmp16 + MULTIPLY(tmp3, FIX(1.065388962)) /* c15+c3+c11-c7 */
	     + MULTIPLY(tmp4, FIX(2.167985692));              /* c1+c13+c5-c9 */

    dataptr[1] = (DCTELEM) DESCALE(tmp10, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp11, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp12, CONST_BITS-PASS1_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp13, CONST_BITS-PASS1_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == DCTSIZE * 2)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/16)**2 = 1/2**2.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + wsptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*4] + wsptr[DCTSIZE*3];
    tmp5 = dataptr[DCTSIZE*5] + wsptr[DCTSIZE*2];
    tmp6 = dataptr[DCTSIZE*6] + wsptr[DCTSIZE*1];
    tmp7 = dataptr[DCTSIZE*7] + wsptr[DCTSIZE*0];

    tmp10 = tmp0 + tmp7;
    tmp14 = tmp0 - tmp7;
    tmp11 = tmp1 + tmp6;
    tmp15 = tmp1 - tmp6;
    tmp12 = tmp2 + tmp5;
    tmp16 = tmp2 - tmp5;
    tmp13 = tmp3 + tmp4;
    tmp17 = tmp3 - tmp4;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] - wsptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*4] - wsptr[DCTSIZE*3];
    tmp5 = dataptr[DCTSIZE*5] - wsptr[DCTSIZE*2];
    tmp6 = dataptr[DCTSIZE*6] - wsptr[DCTSIZE*1];
    tmp7 = dataptr[DCTSIZE*7] - wsptr[DCTSIZE*0];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(tmp10 + tmp11 + tmp12 + tmp13, PASS1_BITS+2);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(1.306562965)) + /* c4[16] = c2[8] */
	      MULTIPLY(tmp11 - tmp12, FIX_0_541196100),   /* c12[16] = c6[8] */
	      CONST_BITS+PASS1_BITS+2);

    tmp10 = MULTIPLY(tmp17 - tmp15, FIX(0.275899379)) +   /* c14[16] = c7[8] */
	    MULTIPLY(tmp14 - tmp16, FIX(1.387039845));    /* c2[16] = c1[8] */

    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp15, FIX(1.451774982))   /* c6+c14 */
	      + MULTIPLY(tmp16, FIX(2.172734804)),        /* c2+10 */
	      CONST_BITS+PASS1_BITS+2);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(0.211164243))   /* c2-c6 */
	      - MULTIPLY(tmp17, FIX(1.061594338)),        /* c10+c14 */
	      CONST_BITS+PASS1_BITS+2);

    /* Odd part */

    tmp11 = MULTIPLY(tmp0 + tmp1, FIX(1.353318001)) +         /* c3 */
	    MULTIPLY(tmp6 - tmp7, FIX(0.410524528));          /* c13 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(1.247225013)) +         /* c5 */
	    MULTIPLY(tmp5 + tmp7, FIX(0.666655658));          /* c11 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(1.093201867)) +         /* c7 */
	    MULTIPLY(tmp4 - tmp7, FIX(0.897167586));          /* c9 */
    tmp14 = MULTIPLY(tmp1 + tmp2, FIX(0.138617169)) +         /* c15 */
	    MULTIPLY(tmp6 - tmp5, FIX(1.407403738));          /* c1 */
    tmp15 = MULTIPLY(tmp1 + tmp3, - FIX(0.666655658)) +       /* -c11 */
	    MULTIPLY(tmp4 + tmp6, - FIX(1.247225013));        /* -c5 */
    tmp16 = MULTIPLY(tmp2 + tmp3, - FIX(1.353318001)) +       /* -c3 */
	    MULTIPLY(tmp5 - tmp4, FIX(0.410524528));          /* c13 */
    tmp10 = tmp11 + tmp12 + tmp13 -
	    MULTIPLY(tmp0, FIX(2.286341144)) +                /* c7+c5+c3-c1 */
	    MULTIPLY(tmp7, FIX(0.779653625));                 /* c15+c13-c11+c9 */
    tmp11 += tmp14 + tmp15 + MULTIPLY(tmp1, FIX(0.071888074)) /* c9-c3-c15+c11 */
	     - MULTIPLY(tmp6, FIX(1.663905119));              /* c7+c13+c1-c5 */
    tmp12 += tmp14 + tmp16 - MULTIPLY(tmp2, FIX(1.125726048)) /* c7+c5+c15-c3 */
	     + MULTIPLY(tmp5, FIX(1.227391138));              /* c9-c11+c1-c13 */
    tmp13 += tmp15 + tmp16 + MULTIPLY(tmp3, FIX(1.065388962)) /* c15+c3+c11-c7 */
	     + MULTIPLY(tmp4, FIX(2.167985692));              /* c1+c13+c5-c9 */

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp10, CONST_BITS+PASS1_BITS+2);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp11, CONST_BITS+PASS1_BITS+2);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp12, CONST_BITS+PASS1_BITS+2);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp13, CONST_BITS+PASS1_BITS+2);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}